

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O2

void clamp_mv_ref(MV *mv,int bw,int bh,MACROBLOCKD *xd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int16_t iVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = xd->mb_to_left_edge + bw * -8 + -0x80;
  iVar5 = bw * 8 + xd->mb_to_right_edge + 0x80;
  iVar1 = xd->mb_to_top_edge + bh * -8 + -0x80;
  iVar3 = bh * 8 + xd->mb_to_bottom_edge + 0x80;
  iVar2 = (int)mv->col;
  if (iVar2 < iVar5) {
    iVar5 = iVar2;
  }
  iVar4 = (int16_t)iVar5;
  if (iVar2 < iVar6) {
    iVar4 = (int16_t)iVar6;
  }
  mv->col = iVar4;
  iVar5 = (int)mv->row;
  if (iVar5 < iVar3) {
    iVar3 = iVar5;
  }
  iVar4 = (int16_t)iVar3;
  if (iVar5 < iVar1) {
    iVar4 = (int16_t)iVar1;
  }
  mv->row = iVar4;
  return;
}

Assistant:

static inline void clamp_mv_ref(MV *mv, int bw, int bh, const MACROBLOCKD *xd) {
  const SubpelMvLimits mv_limits = {
    xd->mb_to_left_edge - GET_MV_SUBPEL(bw) - MV_BORDER,
    xd->mb_to_right_edge + GET_MV_SUBPEL(bw) + MV_BORDER,
    xd->mb_to_top_edge - GET_MV_SUBPEL(bh) - MV_BORDER,
    xd->mb_to_bottom_edge + GET_MV_SUBPEL(bh) + MV_BORDER
  };
  clamp_mv(mv, &mv_limits);
}